

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

void __thiscall ddd::DictionaryMLT<false,_true>::shrink(DictionaryMLT<false,_true> *this)

{
  DaTrie<false,_true,_false> *this_00;
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3);
      uVar1 = uVar1 + 1) {
    this_00 = *(DaTrie<false,_true,_false> **)(*(long *)(this + 0x10) + uVar1 * 8);
    if (this_00 != (DaTrie<false,_true,_false> *)0x0) {
      DaTrie<false,_true,_false>::shrink(this_00);
    }
  }
  return;
}

Assistant:

void shrink() {
    for (size_t i = 0; i < suffix_subtries_.size(); ++i) {
      if (suffix_subtries_[i]) {
        suffix_subtries_[i]->shrink();
      }
    }
  }